

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  pointer psVar6;
  unsigned_long uVar7;
  undefined1 local_88 [56];
  string local_50;
  
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  psVar6 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6;
  uVar7 = 0;
  while( true ) {
    if (lVar5 >> 4 == uVar7) {
      return __return_storage_ptr__;
    }
    peVar1 = (psVar6->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (lVar4 = __dynamic_cast(peVar1,&Pattern::typeinfo,&Argument::typeinfo,0), lVar4 != 0)) break;
    uVar7 = uVar7 + 1;
    psVar6 = psVar6 + 1;
  }
  iVar3 = (*(this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
  std::__cxx11::string::string((string *)&local_50,(string *)CONCAT44(extraout_var,iVar3));
  value::value((value *)(local_88 + 0x10),&local_50);
  bVar2 = operator==((value *)(local_88 + 0x10),(value *)(lVar4 + 0x28));
  value::~value((value *)(local_88 + 0x10));
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->first = uVar7;
  iVar3 = (*(this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
  local_88._16_4_ = 1;
  local_88[0x18] = '\x01';
  std::make_shared<docopt::Command,std::__cxx11::string_const&,docopt::value>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (value *)CONCAT44(extraout_var_00,iVar3));
  std::__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2> *)
             &__return_storage_ptr__->second,
             (__shared_ptr<docopt::Command,_(__gnu_cxx::_Lock_policy)2> *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  value::~value((value *)(local_88 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}